

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

void __thiscall
wallet::OutputGroup::Insert
          (OutputGroup *this,shared_ptr<wallet::COutput> *output,size_t ancestors,size_t descendants
          )

{
  int iVar1;
  long lVar2;
  element_type *peVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::push_back(&this->m_outputs,output);
  peVar3 = (this->m_outputs).
           super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar3->fee).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged == false) {
    __assert_fail("fee.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.h"
                  ,0x7c,"CAmount wallet::COutput::GetFee() const");
  }
  this->fee = this->fee +
              (peVar3->fee).super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value;
  if (peVar3->input_bytes < 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = CFeeRate::GetFee(&this->m_long_term_feerate,peVar3->input_bytes);
  }
  peVar3->long_term_fee = lVar4;
  this->long_term_fee = this->long_term_fee + lVar4;
  if ((peVar3->effective_value).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged != false) {
    this->effective_value =
         this->effective_value +
         *(long *)&(peVar3->effective_value).super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
    this->m_from_me = (bool)(this->m_from_me & peVar3->from_me);
    this->m_value = this->m_value + (peVar3->txout).nValue;
    iVar1 = this->m_depth;
    if (peVar3->depth < this->m_depth) {
      iVar1 = peVar3->depth;
    }
    this->m_depth = iVar1;
    this->m_ancestors = this->m_ancestors + ancestors;
    if (descendants < this->m_descendants) {
      descendants = this->m_descendants;
    }
    this->m_descendants = descendants;
    iVar1 = ((output->super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            input_bytes;
    if (0 < iVar1) {
      this->m_weight = this->m_weight + iVar1 * 4;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("effective_value.has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.h"
                ,0x82,"CAmount wallet::COutput::GetEffectiveValue() const");
}

Assistant:

void OutputGroup::Insert(const std::shared_ptr<COutput>& output, size_t ancestors, size_t descendants) {
    m_outputs.push_back(output);
    auto& coin = *m_outputs.back();

    fee += coin.GetFee();

    coin.long_term_fee = coin.input_bytes < 0 ? 0 : m_long_term_feerate.GetFee(coin.input_bytes);
    long_term_fee += coin.long_term_fee;

    effective_value += coin.GetEffectiveValue();

    m_from_me &= coin.from_me;
    m_value += coin.txout.nValue;
    m_depth = std::min(m_depth, coin.depth);
    // ancestors here express the number of ancestors the new coin will end up having, which is
    // the sum, rather than the max; this will overestimate in the cases where multiple inputs
    // have common ancestors
    m_ancestors += ancestors;
    // descendants is the count as seen from the top ancestor, not the descendants as seen from the
    // coin itself; thus, this value is counted as the max, not the sum
    m_descendants = std::max(m_descendants, descendants);

    if (output->input_bytes > 0) {
        m_weight += output->input_bytes * WITNESS_SCALE_FACTOR;
    }
}